

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCase::iterate(TextureLevelCase *this)

{
  code *pcVar1;
  GLuint *pGVar2;
  GLuint *buffers;
  ostringstream *poVar3;
  byte bVar4;
  GLenum GVar5;
  TestLog *log;
  pointer pTVar6;
  pointer pTVar7;
  iterator __position;
  TextureLevelCase *pTVar8;
  int iVar9;
  GLenum GVar10;
  long *plVar11;
  undefined8 *puVar12;
  undefined4 extraout_var;
  TextureFormat texFormat;
  TransferFormat TVar13;
  pointer piVar14;
  int iVar15;
  ulong *puVar16;
  Functions *pFVar17;
  size_type *psVar18;
  long lVar19;
  long lVar20;
  IterateResult IVar21;
  GLenum GVar22;
  ulong uVar23;
  long lVar24;
  pointer pTVar25;
  undefined1 local_310 [16];
  undefined1 local_300 [24];
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  TextureLevelCase *local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  long *local_288;
  undefined8 local_280;
  long local_278;
  undefined8 uStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  ScopedLogSection section;
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  int *local_1e0;
  GLuint *local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  MessageBuilder msg;
  
  pTVar25 = (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_iteration;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_300._16_8_ = &local_2e0;
  local_2e0._M_allocated_capacity = 0x6f69746172657449;
  local_2e0._8_2_ = 0x6e;
  local_2e8 = 9;
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1e0 = &this->m_iteration;
  puVar16 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar16) {
    local_258 = *puVar16;
    lStack_250 = plVar11[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *puVar16;
    local_268 = (ulong *)*plVar11;
  }
  local_260 = plVar11[1];
  *plVar11 = (long)puVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  iVar9 = *local_1e0;
  local_2b0 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  std::ostream::operator<<(&msg,iVar9 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  std::ios_base::~ios_base
            ((ios_base *)&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x68);
  uVar23 = 0xf;
  if (local_268 != &local_258) {
    uVar23 = local_258;
  }
  if (uVar23 < (ulong)(local_1f8 + local_260)) {
    uVar23 = 0xf;
    if (local_200 != local_1f0) {
      uVar23 = local_1f0[0];
    }
    if (uVar23 < (ulong)(local_1f8 + local_260)) goto LAB_014d93e5;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_268);
  }
  else {
LAB_014d93e5:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_200);
  }
  local_288 = &local_278;
  plVar11 = puVar12 + 2;
  if ((long *)*puVar12 == plVar11) {
    local_278 = *plVar11;
    uStack_270 = puVar12[3];
  }
  else {
    local_278 = *plVar11;
    local_288 = (long *)*puVar12;
  }
  local_280 = puVar12[1];
  *puVar12 = plVar11;
  puVar12[1] = 0;
  *(undefined1 *)plVar11 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
  puVar16 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar16) {
    local_238 = *puVar16;
    lStack_230 = plVar11[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *puVar16;
    local_248 = (ulong *)*plVar11;
  }
  local_240 = plVar11[1];
  *plVar11 = (long)puVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  pTVar6 = (local_2b0->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar7 = (local_2b0->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  std::ostream::operator<<(&msg,(int)((ulong)((long)pTVar7 - (long)pTVar6) >> 3) * -0x45d1745d);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  std::ios_base::~ios_base
            ((ios_base *)&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x68);
  uVar23 = 0xf;
  if (local_248 != &local_238) {
    uVar23 = local_238;
  }
  if (uVar23 < (ulong)(local_218 + local_240)) {
    uVar23 = 0xf;
    if (local_220 != local_210) {
      uVar23 = local_210[0];
    }
    if ((ulong)(local_218 + local_240) <= uVar23) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_248);
      goto LAB_014d95ad;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_220);
LAB_014d95ad:
  local_2a8 = (code *)&local_298;
  pcVar1 = (code *)(puVar12 + 2);
  if ((code *)*puVar12 == pcVar1) {
    local_298 = *(long *)pcVar1;
    uStack_290 = puVar12[3];
  }
  else {
    local_298 = *(long *)pcVar1;
    local_2a8 = (code *)*puVar12;
  }
  local_2a0 = puVar12[1];
  *puVar12 = pcVar1;
  puVar12[1] = 0;
  *pcVar1 = (code)0x0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  pFVar17 = (Functions *)(plVar11 + 2);
  if ((Functions *)*plVar11 == pFVar17) {
    local_300._0_8_ = pFVar17->activeShaderProgram;
    local_300._8_8_ = plVar11[3];
    local_310._0_8_ = (Functions *)(local_310 + 0x10);
  }
  else {
    local_300._0_8_ = pFVar17->activeShaderProgram;
    local_310._0_8_ = (Functions *)*plVar11;
  }
  local_310._8_8_ = plVar11[1];
  *plVar11 = (long)pFVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append
                              (local_310,(ulong)(pTVar25->description)._M_dataplus._M_p);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  psVar18 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_2d0.field_2._M_allocated_capacity = *psVar18;
    local_2d0.field_2._8_8_ = plVar11[3];
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar18;
    local_2d0._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_2d0._M_string_length = plVar11[1];
  *plVar11 = (long)psVar18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)(local_300 + 0x10),&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((Functions *)local_310._0_8_ != (Functions *)(local_310 + 0x10)) {
    operator_delete((void *)local_310._0_8_,(ulong)(local_300._0_8_ + 1));
  }
  if (local_2a8 != (code *)&local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  pTVar8 = local_2b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._16_8_ != &local_2e0) {
    operator_delete((void *)local_300._16_8_,local_2e0._M_allocated_capacity + 1);
  }
  iVar9 = (*((pTVar8->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_310,(Functions *)CONCAT44(extraout_var,iVar9),
             ((pTVar8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_300[0] = true;
  pGVar2 = &pTVar8->m_texture;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)local_310,1,pGVar2);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_310,pTVar25->bindTarget,*pGVar2);
  GVar10 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_310);
  glu::checkError(GVar10,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureLevelStateQueryTests.cpp"
                  ,0x3bd);
  buffers = &pTVar8->m_texBuffer;
  lVar20 = *(long *)&(pTVar25->levels).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                     ._M_impl.super__Vector_impl_data;
  local_1d8 = pGVar2;
  if (0 < (int)((ulong)((long)(pTVar25->levels).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar20) >> 3) *
          -0x55555555) {
    poVar3 = &msg.m_str;
    lVar24 = 0;
    lVar19 = 0;
    do {
      bVar4 = *(byte *)(lVar20 + 0x14 + lVar24);
      if (bVar4 == 0) {
        texFormat = glu::mapGLInternalFormat(*(deUint32 *)(lVar20 + 0x10 + lVar24));
        TVar13 = glu::getTransferFormat(texFormat);
        GVar10 = TVar13.dataType;
        lVar20 = *(long *)&(pTVar25->levels).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                           ._M_impl.super__Vector_impl_data;
        bVar4 = *(byte *)(lVar20 + 0x14 + lVar24);
      }
      else {
        GVar10 = 0;
        TVar13.format = 0;
        TVar13.dataType = 0;
      }
      GVar5 = pTVar25->bindTarget;
      if (pTVar25->immutable == true) {
        GVar10 = 0xde1;
        if (GVar5 == 0xde1 && (bVar4 & 1) == 0) {
LAB_014d99d9:
          glu::CallLogWrapper::glTexStorage2D
                    ((CallLogWrapper *)local_310,GVar10,1,*(GLenum *)(lVar20 + 0x10 + lVar24),
                     *(GLsizei *)(lVar20 + lVar24),*(GLsizei *)(lVar20 + 4 + lVar24));
        }
        else if ((((bVar4 & 1) == 0) && (GVar10 = 0x806f, GVar5 == 0x806f)) ||
                (((bVar4 & 1) == 0 && (GVar10 = 0x8c1a, GVar5 == 0x8c1a)))) {
LAB_014d992b:
          glu::CallLogWrapper::glTexStorage3D
                    ((CallLogWrapper *)local_310,GVar10,1,*(GLenum *)(lVar20 + 0x10 + lVar24),
                     *(GLsizei *)(lVar20 + lVar24),*(GLsizei *)(lVar20 + 4 + lVar24),
                     *(GLsizei *)(lVar20 + 8 + lVar24));
        }
        else {
          if (((bVar4 & 1) == 0) && (GVar10 = 0x8513, GVar5 == 0x8513)) goto LAB_014d99d9;
          if (((bVar4 & 1) == 0) && (GVar5 == 0x9100)) {
            glu::CallLogWrapper::glTexStorage2DMultisample
                      ((CallLogWrapper *)local_310,0x9100,pTVar25->sampleCount,
                       *(GLenum *)(lVar20 + 0x10 + lVar24),*(GLsizei *)(lVar20 + lVar24),
                       *(GLsizei *)(lVar20 + 4 + lVar24),pTVar25->fixedSamplePos);
          }
          else if (((bVar4 & 1) == 0) && (GVar5 == 0x9102)) {
            glu::CallLogWrapper::glTexStorage3DMultisample
                      ((CallLogWrapper *)local_310,0x9102,pTVar25->sampleCount,
                       *(GLenum *)(lVar20 + 0x10 + lVar24),*(GLsizei *)(lVar20 + lVar24),
                       *(GLsizei *)(lVar20 + 4 + lVar24),*(GLsizei *)(lVar20 + 8 + lVar24),
                       pTVar25->fixedSamplePos);
          }
          else {
            if (((bVar4 & 1) == 0) && (GVar10 = 0x9009, GVar5 == 0x9009)) goto LAB_014d992b;
            if (((bVar4 & 1) == 0) && (GVar5 == 0x8c2a)) {
              glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)local_310,1,buffers);
              glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)local_310,0x8c2a,*buffers);
              if (pTVar25->bindWholeArray == true) {
                glu::CallLogWrapper::glBufferData
                          ((CallLogWrapper *)local_310,0x8c2a,(long)pTVar25->texBufferDataSize,
                           (void *)0x0,0x88e4);
                glu::CallLogWrapper::glTexBuffer
                          ((CallLogWrapper *)local_310,0x8c2a,
                           *(GLenum *)
                            (*(long *)&(pTVar25->levels).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                       ._M_impl.super__Vector_impl_data + 0x10 + lVar24),*buffers);
              }
              else {
                glu::CallLogWrapper::glBufferData
                          ((CallLogWrapper *)local_310,0x8c2a,
                           (long)(pTVar25->texBufferDataSize + pTVar25->texBufferDataOffset),
                           (void *)0x0,0x88e4);
                glu::CallLogWrapper::glTexBufferRange
                          ((CallLogWrapper *)local_310,0x8c2a,
                           *(GLenum *)
                            (*(long *)&(pTVar25->levels).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                       ._M_impl.super__Vector_impl_data + 0x10 + lVar24),*buffers,
                           (long)pTVar25->texBufferDataOffset,(long)pTVar25->texBufferDataSize);
              }
            }
          }
        }
      }
      else {
        GVar22 = 0xde1;
        if (GVar5 == 0xde1 && (bVar4 & 1) == 0) {
LAB_014d9a0f:
          glu::CallLogWrapper::glTexImage2D
                    ((CallLogWrapper *)local_310,GVar22,*(GLint *)(lVar20 + 0xc + lVar24),
                     *(GLint *)(lVar20 + 0x10 + lVar24),*(GLsizei *)(lVar20 + lVar24),
                     *(GLsizei *)(lVar20 + 4 + lVar24),0,TVar13.format,GVar10,(void *)0x0);
        }
        else {
          if ((((bVar4 & 1) != 0) || (GVar22 = 0x806f, GVar5 != 0x806f)) &&
             (((bVar4 & 1) != 0 || (GVar22 = 0x8c1a, GVar5 != 0x8c1a)))) {
            if (((bVar4 & 1) == 0) && (GVar5 == 0x8513)) {
              GVar22 = pTVar25->queryTarget;
              goto LAB_014d9a0f;
            }
            if (((bVar4 & 1) != 0) || (GVar22 = 0x9009, GVar5 != 0x9009)) {
              if (((bVar4 & 1) == 0) || (GVar5 != 0xde1)) {
                if (((bVar4 & 1) != 0) && (GVar5 == 0x8c1a)) {
                  glu::CallLogWrapper::glCompressedTexImage3D
                            ((CallLogWrapper *)local_310,0x8c1a,*(GLint *)(lVar20 + 0xc + lVar24),
                             *(GLenum *)(lVar20 + 0x10 + lVar24),*(GLsizei *)(lVar20 + lVar24),
                             *(GLsizei *)(lVar20 + 4 + lVar24),*(GLsizei *)(lVar20 + 8 + lVar24),0,
                             0x400,Functional::(anonymous_namespace)::
                                   applyTextureGenerationSpec(glu::CallLogWrapper&,deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec_const&,unsigned_int&)
                                   ::buffer);
                }
              }
              else {
                glu::CallLogWrapper::glCompressedTexImage2D
                          ((CallLogWrapper *)local_310,0xde1,*(GLint *)(lVar20 + 0xc + lVar24),
                           *(GLenum *)(lVar20 + 0x10 + lVar24),*(GLsizei *)(lVar20 + lVar24),
                           *(GLsizei *)(lVar20 + 4 + lVar24),0,0x200,
                           Functional::(anonymous_namespace)::
                           applyTextureGenerationSpec(glu::CallLogWrapper&,deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec_const&,unsigned_int&)
                           ::buffer);
              }
              goto LAB_014d9a35;
            }
          }
          glu::CallLogWrapper::glTexImage3D
                    ((CallLogWrapper *)local_310,GVar22,*(GLint *)(lVar20 + 0xc + lVar24),
                     *(GLint *)(lVar20 + 0x10 + lVar24),*(GLsizei *)(lVar20 + lVar24),
                     *(GLsizei *)(lVar20 + 4 + lVar24),*(GLsizei *)(lVar20 + 8 + lVar24),0,
                     TVar13.format,GVar10,(void *)0x0);
        }
      }
LAB_014d9a35:
      GVar10 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_310);
      if (GVar10 != 0) {
        msg.m_log = (TestLog *)local_310._8_8_;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
        local_2a8 = glu::getErrorName;
        local_2a0 = CONCAT44(local_2a0._4_4_,GVar10);
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2d0,&local_2a8);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,0x1c59f77);
        psVar18 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_2e0._M_allocated_capacity = *psVar18;
          local_2e0._8_8_ = plVar11[3];
          local_300._16_8_ = &local_2e0;
        }
        else {
          local_2e0._M_allocated_capacity = *psVar18;
          local_300._16_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_2e8 = plVar11[1];
        *plVar11 = (long)psVar18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,
                   (char *)local_300._16_8_,local_2e8);
        tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._16_8_ != &local_2e0) {
          operator_delete((void *)local_300._16_8_,local_2e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
        std::ios_base::~ios_base
                  ((ios_base *)
                   &msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      }
      lVar19 = lVar19 + 1;
      lVar20 = *(long *)&(pTVar25->levels).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                         ._M_impl.super__Vector_impl_data;
      lVar24 = lVar24 + 0x18;
    } while (lVar19 < (int)((ulong)((long)(pTVar25->levels).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - lVar20) >> 3)
                      * -0x55555555);
  }
  pTVar8 = local_2b0;
  iVar9 = (*(local_2b0->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (local_2b0,local_310,pTVar25);
  pGVar2 = local_1d8;
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)local_310,1,local_1d8);
  *pGVar2 = 0;
  if (*buffers != 0) {
    glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)local_310,1,buffers);
    *pGVar2 = 0;
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_310);
  tcu::TestLog::endSection(section.m_log);
  if ((char)iVar9 == '\0') {
    __position._M_current =
         (pTVar8->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pTVar8->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&pTVar8->m_failedIterations,__position,local_1e0
                );
    }
    else {
      *__position._M_current = pTVar8->m_iteration;
      (pTVar8->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pTVar8->m_allIterationsOk = false;
  }
  iVar9 = pTVar8->m_iteration + 1;
  pTVar8->m_iteration = iVar9;
  iVar15 = (int)((ulong)((long)(pTVar8->m_iterations).
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar8->m_iterations).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  IVar21 = CONTINUE;
  if (SBORROW4(iVar9,iVar15 * -0x45d1745d) == iVar9 + iVar15 * 0x45d1745d < 0) {
    if (pTVar8->m_allIterationsOk == true) {
      IVar21 = STOP;
      tcu::TestContext::setTestResult
                ((pTVar8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      msg.m_log = ((pTVar8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar3 = &msg.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,
                 "Following iteration(s) failed: ",0x1f);
      piVar14 = (pTVar8->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(pTVar8->m_failedIterations).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar14) >> 2)) {
        lVar20 = 0;
        do {
          if (lVar20 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
            piVar14 = (pTVar8->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          std::ostream::operator<<(poVar3,piVar14[lVar20] + 1);
          lVar20 = lVar20 + 1;
          piVar14 = (pTVar8->m_failedIterations).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (lVar20 < (int)((ulong)((long)(pTVar8->m_failedIterations).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish - (long)piVar14) >>
                               2));
      }
      tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestContext::setTestResult
                ((pTVar8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"One or more iterations failed");
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      std::ios_base::~ios_base
                ((ios_base *)
                 &msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      IVar21 = STOP;
    }
  }
  return IVar21;
}

Assistant:

TextureLevelCase::IterateResult TextureLevelCase::iterate (void)
{
	const bool result = testConfig(m_iterations[m_iteration]);

	if (!result)
	{
		m_failedIterations.push_back(m_iteration);
		m_allIterationsOk = false;
	}

	if (++m_iteration < (int)m_iterations.size())
		return CONTINUE;

	if (m_allIterationsOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		tcu::MessageBuilder msg(&m_testCtx.getLog());

		msg << "Following iteration(s) failed: ";
		for (int ndx = 0; ndx < (int)m_failedIterations.size(); ++ndx)
		{
			if (ndx)
				msg << ", ";
			msg << (m_failedIterations[ndx] + 1);
		}
		msg << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "One or more iterations failed");
	}
	return STOP;
}